

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int32_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>::
decode_run_interruption_error
          (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
           *this,context_run_mode *context)

{
  int32_t iVar1;
  int32_t e_mapped_error_value;
  
  iVar1 = context_run_mode::get_golomb_code(context);
  e_mapped_error_value =
       decode_value(this,iVar1,~*(uint *)(J + (long)this->run_index_ * 4) + (this->traits_).limit,
                    (this->traits_).quantized_bits_per_pixel);
  iVar1 = context_run_mode::compute_error_value
                    (context,context->run_interruption_type_ + e_mapped_error_value,iVar1);
  context_run_mode::update_variables(context,iVar1,e_mapped_error_value,this->reset_threshold_);
  return iVar1;
}

Assistant:

int32_t decode_run_interruption_error(context_run_mode& context)
    {
        const int32_t k{context.get_golomb_code()};
        const int32_t e_mapped_error_value{
            decode_value(k, traits_.limit - J[run_index_] - 1, traits_.quantized_bits_per_pixel)};
        const int32_t error_value{context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k)};
        context.update_variables(error_value, e_mapped_error_value, reset_threshold_);
        return error_value;
    }